

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_pbeh.c
# Opt level: O0

void hyb_gga_xc_relpbe_init(xc_func_type *p)

{
  xc_func_type *in_RDI;
  int in_stack_0000000c;
  xc_func_type *in_stack_00000010;
  
  xc_mix_init(in_stack_00000010,in_stack_0000000c,(int *)p,(double *)in_RDI);
  xc_hyb_init_hybrid(in_RDI,0.0);
  return;
}

Assistant:

static void
hyb_gga_xc_relpbe_init(xc_func_type *p)
{
  /* Note that the value of funcs_coef[0] and hyb_coeff will be set
     by set_ext_params */
  static int   funcs_id   [3] = {XC_GGA_X_PBE, XC_GGA_C_PBE, XC_LDA_C_PW_MOD};
  static double funcs_coef[3] = {0.0, 0.0, 0.0};
  xc_mix_init(p, 3, funcs_id, funcs_coef);
  xc_hyb_init_hybrid(p, 0.0);
}